

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

cmStateSnapshot * __thiscall cmState::Reset(cmStateSnapshot *__return_storage_ptr__,cmState *this)

{
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *this_00;
  cmLinkedTree<cmDefinitions> *this_01;
  pointer pcVar1;
  StackIter begin;
  StackIter end;
  StackIter begin_00;
  StackIter end_00;
  cmStateSnapshot *pcVar2;
  bool bVar3;
  PointerType pBVar4;
  PointerType pSVar5;
  string *psVar6;
  PointerType pcVar7;
  iterator iVar8;
  allocator<char> local_a9;
  PositionType pos;
  iterator it;
  string binDir;
  string local_58;
  cmStateSnapshot *local_38;
  
  local_38 = __return_storage_ptr__;
  cmPropertyMap::Clear(&this->GlobalProperties);
  std::
  _Rb_tree<cmProperty::ScopeType,_std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>,_std::_Select1st<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
  ::clear((_Rb_tree<cmProperty::ScopeType,_std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>,_std::_Select1st<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
           *)this);
  cmGlobVerificationManager::Reset
            ((this->GlobVerificationManager)._M_t.
             super___uniq_ptr_impl<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGlobVerificationManager_*,_std::default_delete<cmGlobVerificationManager>_>
             .super__Head_base<0UL,_cmGlobVerificationManager_*,_false>._M_head_impl);
  pos = cmLinkedTree<cmStateDetail::SnapshotDataType>::Truncate(&this->SnapshotData);
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Truncate(&this->ExecutionListFiles);
  it = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::Truncate
                 (&this->BuildsystemDirectory);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar4->IncludeDirectories);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar4->IncludeDirectoryBacktraces);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar4->CompileDefinitions);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar4->CompileDefinitionsBacktraces);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar4->CompileOptions);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar4->CompileOptionsBacktraces);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar4->LinkOptions);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar4->LinkOptionsBacktraces);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar4->LinkDirectories);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar4->LinkDirectoriesBacktraces);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  (pBVar4->DirectoryEnd).Tree = pos.Tree;
  (pBVar4->DirectoryEnd).Position = pos.Position;
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar4->NormalTargetNames);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  cmPropertyMap::Clear(&pBVar4->Properties);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(&it);
  pcVar1 = (pBVar4->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pBVar4->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
      _M_impl.super__Vector_impl_data._M_finish != pcVar1) {
    (pBVar4->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl
    .super__Vector_impl_data._M_finish = pcVar1;
  }
  this_00 = &this->PolicyStack;
  cmLinkedTree<cmStateDetail::PolicyStackEntry>::Clear(this_00);
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
  (pSVar5->Policies).Tree = this_00;
  (pSVar5->Policies).Position = 0;
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
  (pSVar5->PolicyRoot).Tree = this_00;
  (pSVar5->PolicyRoot).Position = 0;
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
  (pSVar5->PolicyScope).Tree = this_00;
  (pSVar5->PolicyScope).Position = 0;
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
  bVar3 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::IsValid(&pSVar5->Policies);
  if (bVar3) {
    pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
    bVar3 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::IsValid(&pSVar5->PolicyRoot);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&binDir,"CMAKE_SOURCE_DIR",(allocator<char> *)&local_58);
      pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      begin.Tree = (pSVar5->Vars).Tree;
      begin.Position = (pSVar5->Vars).Position;
      pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      end.Tree = (pSVar5->Root).Tree;
      end.Position = (pSVar5->Root).Position;
      psVar6 = cmDefinitions::Get(&binDir,begin,end);
      std::__cxx11::string::string((string *)&it,(string *)psVar6);
      std::__cxx11::string::~string((string *)&binDir);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"CMAKE_BINARY_DIR",&local_a9);
      pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      begin_00.Tree = (pSVar5->Vars).Tree;
      begin_00.Position = (pSVar5->Vars).Position;
      pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      end_00.Tree = (pSVar5->Root).Tree;
      end_00.Position = (pSVar5->Root).Position;
      psVar6 = cmDefinitions::Get(&local_58,begin_00,end_00);
      std::__cxx11::string::string((string *)&binDir,(string *)psVar6);
      std::__cxx11::string::~string((string *)&local_58);
      this_01 = &this->VarTree;
      cmLinkedTree<cmDefinitions>::Clear(this_01);
      iVar8.Position = 0;
      iVar8.Tree = this_01;
      iVar8 = cmLinkedTree<cmDefinitions>::Push(this_01,iVar8);
      pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      pSVar5->Vars = iVar8;
      pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      (pSVar5->Parent).Tree = this_01;
      (pSVar5->Parent).Position = 0;
      pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      (pSVar5->Root).Tree = this_01;
      (pSVar5->Root).Position = 0;
      pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      pcVar7 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar5->Vars);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"CMAKE_SOURCE_DIR",&local_a9);
      cmDefinitions::Set(pcVar7,&local_58,(char *)it.Tree);
      std::__cxx11::string::~string((string *)&local_58);
      pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&pos);
      pcVar7 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar5->Vars);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"CMAKE_BINARY_DIR",&local_a9);
      cmDefinitions::Set(pcVar7,&local_58,binDir._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&binDir);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&it,"RULE_LAUNCH_COMPILE",(allocator<char> *)&binDir);
      DefineProperty(this,(string *)&it,DIRECTORY,"","",true);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&it,"RULE_LAUNCH_LINK",(allocator<char> *)&binDir);
      DefineProperty(this,(string *)&it,DIRECTORY,"","",true);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&it,"RULE_LAUNCH_CUSTOM",(allocator<char> *)&binDir);
      DefineProperty(this,(string *)&it,DIRECTORY,"","",true);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&it,"RULE_LAUNCH_COMPILE",(allocator<char> *)&binDir);
      DefineProperty(this,(string *)&it,TARGET,"","",true);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&it,"RULE_LAUNCH_LINK",(allocator<char> *)&binDir);
      DefineProperty(this,(string *)&it,TARGET,"","",true);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&it,"RULE_LAUNCH_CUSTOM",(allocator<char> *)&binDir);
      DefineProperty(this,(string *)&it,TARGET,"","",true);
      std::__cxx11::string::~string((string *)&it);
      pcVar2 = local_38;
      cmStateSnapshot::cmStateSnapshot(local_38,this,pos);
      return pcVar2;
    }
    __assert_fail("pos->PolicyRoot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmState.cxx"
                  ,299,"cmStateSnapshot cmState::Reset()");
  }
  __assert_fail("pos->Policies.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmState.cxx"
                ,0x12a,"cmStateSnapshot cmState::Reset()");
}

Assistant:

cmStateSnapshot cmState::Reset()
{
  this->GlobalProperties.Clear();
  this->PropertyDefinitions.clear();
  this->GlobVerificationManager->Reset();

  cmStateDetail::PositionType pos = this->SnapshotData.Truncate();
  this->ExecutionListFiles.Truncate();

  {
    cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator it =
      this->BuildsystemDirectory.Truncate();
    it->IncludeDirectories.clear();
    it->IncludeDirectoryBacktraces.clear();
    it->CompileDefinitions.clear();
    it->CompileDefinitionsBacktraces.clear();
    it->CompileOptions.clear();
    it->CompileOptionsBacktraces.clear();
    it->LinkOptions.clear();
    it->LinkOptionsBacktraces.clear();
    it->LinkDirectories.clear();
    it->LinkDirectoriesBacktraces.clear();
    it->DirectoryEnd = pos;
    it->NormalTargetNames.clear();
    it->Properties.Clear();
    it->Children.clear();
  }

  this->PolicyStack.Clear();
  pos->Policies = this->PolicyStack.Root();
  pos->PolicyRoot = this->PolicyStack.Root();
  pos->PolicyScope = this->PolicyStack.Root();
  assert(pos->Policies.IsValid());
  assert(pos->PolicyRoot.IsValid());

  {
    std::string srcDir =
      *cmDefinitions::Get("CMAKE_SOURCE_DIR", pos->Vars, pos->Root);
    std::string binDir =
      *cmDefinitions::Get("CMAKE_BINARY_DIR", pos->Vars, pos->Root);
    this->VarTree.Clear();
    pos->Vars = this->VarTree.Push(this->VarTree.Root());
    pos->Parent = this->VarTree.Root();
    pos->Root = this->VarTree.Root();

    pos->Vars->Set("CMAKE_SOURCE_DIR", srcDir.c_str());
    pos->Vars->Set("CMAKE_BINARY_DIR", binDir.c_str());
  }

  this->DefineProperty("RULE_LAUNCH_COMPILE", cmProperty::DIRECTORY, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_LINK", cmProperty::DIRECTORY, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_CUSTOM", cmProperty::DIRECTORY, "", "",
                       true);

  this->DefineProperty("RULE_LAUNCH_COMPILE", cmProperty::TARGET, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_LINK", cmProperty::TARGET, "", "", true);
  this->DefineProperty("RULE_LAUNCH_CUSTOM", cmProperty::TARGET, "", "", true);

  return cmStateSnapshot(this, pos);
}